

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::SharedPtr
          (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *this,
          Unique<vk::Handle<(vk::HandleType)6>_> *ptr)

{
  Unique<vk::Handle<(vk::HandleType)6>_> *pUVar1;
  SharedPtrState<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>,_de::DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>
  *pSVar2;
  DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> local_25 [13];
  Unique<vk::Handle<(vk::HandleType)6>_> *local_18;
  Unique<vk::Handle<(vk::HandleType)6>_> *ptr_local;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *this_local;
  
  this->m_ptr = (Unique<vk::Handle<(vk::HandleType)6>_> *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Unique<vk::Handle<(vk::HandleType)6>_> *)this;
  pSVar2 = (SharedPtrState<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>,_de::DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>
            *)operator_new(0x20);
  pUVar1 = local_18;
  DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::DefaultDeleter(local_25);
  SharedPtrState<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>,_de::DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>
  ::SharedPtrState(pSVar2,pUVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}